

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void cmGhsMultiTargetGenerator::WriteObjectLangOverride(ostream *fout,cmSourceFile *sourceFile)

{
  bool bVar1;
  char *__s;
  string *__rhs;
  ostream *poVar2;
  string sourceLangProp;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"LANGUAGE",&local_39);
  __s = cmSourceFile::GetProperty(sourceFile,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (__s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
    __rhs = cmSourceFile::GetExtension_abi_cxx11_(sourceFile);
    bVar1 = std::operator==("CXX",&local_38);
    if ((bVar1) &&
       ((bVar1 = std::operator==("c",__rhs), bVar1 || (bVar1 = std::operator==("C",__rhs), bVar1))))
    {
      poVar2 = std::operator<<(fout,"    -dotciscxx");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteObjectLangOverride(
  std::ostream& fout, const cmSourceFile* sourceFile)
{
  const char* rawLangProp = sourceFile->GetProperty("LANGUAGE");
  if (nullptr != rawLangProp) {
    std::string sourceLangProp(rawLangProp);
    std::string const& extension = sourceFile->GetExtension();
    if ("CXX" == sourceLangProp && ("c" == extension || "C" == extension)) {
      fout << "    -dotciscxx" << std::endl;
    }
  }
}